

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alSource3i(ALuint name,ALenum param,ALint value1,ALint value2,ALint value3)

{
  ALint value3_local;
  ALint value2_local;
  ALint value1_local;
  ALenum param_local;
  ALuint name_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSource3i);
  IO_UINT32(name);
  IO_ENUM(param);
  IO_INT32(value1);
  IO_INT32(value2);
  IO_INT32(value3);
  (*REAL_alSource3i)(name,param,value1,value2,value3);
  check_source_state_from_name(name);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSource3i(ALuint name, ALenum param, ALint value1, ALint value2, ALint value3)
{
    IO_START(alSource3i);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_INT32(value1);
    IO_INT32(value2);
    IO_INT32(value3);
    REAL_alSource3i(name, param, value1, value2, value3);
    check_source_state_from_name(name);
    IO_END();
}